

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.c
# Opt level: O1

int client_connect(char *fileName)

{
  int __fd;
  int iVar1;
  ssize_t sVar2;
  char *__s;
  sockaddr_un address;
  char buffer [256];
  sockaddr local_188;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 uStack_138;
  undefined6 uStack_130;
  undefined2 local_12a;
  undefined6 uStack_128;
  undefined8 uStack_122;
  char local_118 [256];
  
  __fd = socket(1,1,0);
  if (__fd < 0) {
    __s = "socket() failed";
  }
  else {
    local_188.sa_data[6] = '\0';
    local_188.sa_data[7] = '\0';
    local_188.sa_data[8] = '\0';
    local_188.sa_data[9] = '\0';
    local_188.sa_data[10] = '\0';
    local_188.sa_data[0xb] = '\0';
    local_188.sa_data[0xc] = '\0';
    local_188.sa_data[0xd] = '\0';
    uStack_128 = 0;
    uStack_122 = 0;
    uStack_138 = 0;
    uStack_130 = 0;
    local_12a = 0;
    local_148 = 0;
    uStack_140 = 0;
    local_158 = 0;
    uStack_150 = 0;
    local_168 = 0;
    uStack_160 = 0;
    local_178 = 0;
    uStack_170 = 0;
    local_188.sa_family = 1;
    local_188.sa_data[0] = '\0';
    local_188.sa_data[1] = '\0';
    local_188.sa_data[2] = '\0';
    local_188.sa_data[3] = '\0';
    local_188.sa_data[4] = '\0';
    local_188.sa_data[5] = '\0';
    sprintf(local_188.sa_data,fileName);
    iVar1 = connect(__fd,&local_188,0x6e);
    if (iVar1 == 0) {
      builtin_strncpy(local_118,"hello from a client",0x14);
      write(__fd,local_118,0x13);
      sVar2 = read(__fd,local_118,0x100);
      local_118[(int)sVar2] = '\0';
      printf("message from server: %s\n",local_118);
      close(__fd);
      return 0;
    }
    __s = "connect() failed";
  }
  puts(__s);
  return -1;
}

Assistant:

int client_connect(const char* fileName)
{
    int socket_fd = socket(PF_UNIX, SOCK_STREAM, 0);
    if(socket_fd < 0)
    {
        printf("socket() failed\n");
        return (-1);
    }

    struct sockaddr_un address;
    memset(&address, 0, sizeof(struct sockaddr_un));
    address.sun_family = AF_UNIX;
    sprintf(address.sun_path, fileName);

    if(connect(socket_fd, (struct sockaddr*)&address, sizeof(struct sockaddr_un)) != 0)
    {
        printf("connect() failed\n");
        return (-1);
    }

    char buffer[256];
    int nBytes = snprintf(buffer, 256, "hello from a client");
    write(socket_fd, buffer, nBytes);

    nBytes = read(socket_fd, buffer, 256);
    buffer[nBytes] = 0;

    printf("message from server: %s\n", buffer);

    close(socket_fd);

    return 0;
}